

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colamd.c
# Opt level: O2

int symamd(int n,int *A,int *p,int *perm,double *knobs,int *stats,
          _func_void_ptr_size_t_size_t *allocate,_func_void_void_ptr *release)

{
  uint uVar1;
  long lVar2;
  void *pvVar3;
  void *pvVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  size_t sVar8;
  int *piVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  uint uVar15;
  double cknobs [20];
  double default_knobs [20];
  
  if (stats == (int *)0x0) {
    return 0;
  }
  for (lVar2 = 0; lVar2 != 0x14; lVar2 = lVar2 + 1) {
    stats[lVar2] = 0;
  }
  stats[3] = 0;
  stats[4] = -1;
  stats[5] = -1;
  if (A == (int *)0x0) {
    stats[3] = -1;
  }
  else if (p == (int *)0x0) {
    stats[3] = -2;
  }
  else if (n < 0) {
    stats[3] = -4;
    stats[4] = n;
  }
  else {
    uVar12 = (ulong)(uint)n;
    iVar10 = p[uVar12];
    if (iVar10 < 0) {
      stats[3] = -5;
    }
    else {
      if (*p == 0) {
        if (knobs == (double *)0x0) {
          knobs = default_knobs;
          colamd_set_defaults(knobs);
        }
        uVar7 = (ulong)(n + 1);
        pvVar3 = (*allocate)(uVar7,4);
        if (pvVar3 == (void *)0x0) {
          stats[3] = -10;
          return 0;
        }
        pvVar4 = (*allocate)(uVar7,4);
        if (pvVar4 == (void *)0x0) {
          stats[3] = -10;
          (*release)(pvVar3);
          return 0;
        }
        stats[6] = 0;
        for (uVar5 = 0; uVar12 != uVar5; uVar5 = uVar5 + 1) {
          *(undefined4 *)((long)pvVar4 + uVar5 * 4) = 0xffffffff;
        }
        uVar5 = 0;
        do {
          uVar6 = uVar5;
          if (uVar6 == uVar12) {
            *perm = 0;
            iVar10 = 0;
            for (uVar5 = 1; uVar7 != uVar5; uVar5 = uVar5 + 1) {
              iVar10 = iVar10 + *(int *)((long)pvVar3 + uVar5 * 4 + -4);
              perm[uVar5] = iVar10;
            }
            for (uVar7 = 0; uVar12 != uVar7; uVar7 = uVar7 + 1) {
              *(int *)((long)pvVar3 + uVar7 * 4) = perm[uVar7];
            }
            iVar10 = perm[uVar12] / 2;
            sVar8 = colamd_recommended(perm[uVar12],iVar10,n);
            piVar9 = (int *)(*allocate)(sVar8,4);
            if (piVar9 != (int *)0x0) {
              if (stats[3] == 0) {
                iVar11 = 0;
                uVar7 = 0;
                while (uVar5 = uVar7, uVar5 != uVar12) {
                  for (lVar2 = (long)p[uVar5]; uVar7 = uVar5 + 1, lVar2 < p[uVar5 + 1];
                      lVar2 = lVar2 + 1) {
                    lVar14 = (long)A[lVar2];
                    if ((long)uVar5 < lVar14) {
                      iVar13 = *(int *)((long)pvVar3 + lVar14 * 4);
                      *(int *)((long)pvVar3 + lVar14 * 4) = iVar13 + 1;
                      piVar9[iVar13] = iVar11;
                      iVar13 = *(int *)((long)pvVar3 + uVar5 * 4);
                      *(int *)((long)pvVar3 + uVar5 * 4) = iVar13 + 1;
                      piVar9[iVar13] = iVar11;
                      iVar11 = iVar11 + 1;
                    }
                  }
                }
              }
              else {
                for (uVar7 = 0; uVar12 != uVar7; uVar7 = uVar7 + 1) {
                  *(undefined4 *)((long)pvVar4 + uVar7 * 4) = 0xffffffff;
                }
                iVar11 = 0;
                uVar7 = 0;
                while (uVar5 = uVar7, uVar5 != uVar12) {
                  for (lVar2 = (long)p[uVar5]; uVar7 = uVar5 + 1, lVar2 < p[uVar5 + 1];
                      lVar2 = lVar2 + 1) {
                    lVar14 = (long)A[lVar2];
                    if (((long)uVar5 < lVar14) && (uVar5 != *(uint *)((long)pvVar4 + lVar14 * 4))) {
                      iVar13 = *(int *)((long)pvVar3 + lVar14 * 4);
                      *(int *)((long)pvVar3 + lVar14 * 4) = iVar13 + 1;
                      piVar9[iVar13] = iVar11;
                      iVar13 = *(int *)((long)pvVar3 + uVar5 * 4);
                      *(int *)((long)pvVar3 + uVar5 * 4) = iVar13 + 1;
                      piVar9[iVar13] = iVar11;
                      iVar11 = iVar11 + 1;
                      *(int *)((long)pvVar4 + lVar14 * 4) = (int)uVar5;
                    }
                  }
                }
              }
              (*release)(pvVar3);
              (*release)(pvVar4);
              for (lVar2 = 0; lVar2 != 0x14; lVar2 = lVar2 + 1) {
                cknobs[lVar2] = knobs[lVar2];
              }
              cknobs[0] = -1.0;
              cknobs[1] = *knobs;
              colamd(iVar10,n,(int)sVar8,piVar9,perm,cknobs,stats);
              *stats = stats[1];
              (*release)(piVar9);
              return 1;
            }
            stats[3] = -10;
LAB_0010d5e9:
            (*release)(pvVar3);
            (*release)(pvVar4);
            return 0;
          }
          iVar10 = p[uVar6 + 1];
          lVar2 = (long)p[uVar6];
          iVar13 = iVar10 - p[uVar6];
          iVar11 = (int)uVar6;
          if (iVar13 < 0) {
            stats[3] = -8;
            stats[4] = iVar11;
            stats[5] = iVar13;
            goto LAB_0010d5e9;
          }
          uVar15 = 0xffffffff;
          for (; uVar5 = uVar6 + 1, lVar2 < iVar10; lVar2 = lVar2 + 1) {
            uVar1 = A[lVar2];
            uVar5 = (ulong)uVar1;
            if ((uint)n <= uVar1) {
              stats[3] = -9;
              stats[4] = iVar11;
              stats[5] = uVar1;
              stats[6] = n;
              goto LAB_0010d5e9;
            }
            if (((int)uVar1 <= (int)uVar15) || (uVar6 == *(uint *)((long)pvVar4 + uVar5 * 4))) {
              stats[3] = 1;
              stats[4] = iVar11;
              stats[5] = uVar1;
              stats[6] = stats[6] + 1;
            }
            if (((long)uVar6 < (long)(int)uVar1) && (uVar6 != *(uint *)((long)pvVar4 + uVar5 * 4)))
            {
              piVar9 = (int *)((long)pvVar3 + uVar5 * 4);
              *piVar9 = *piVar9 + 1;
              piVar9 = (int *)((long)pvVar3 + uVar6 * 4);
              *piVar9 = *piVar9 + 1;
            }
            *(int *)((long)pvVar4 + uVar5 * 4) = iVar11;
            iVar10 = p[uVar6 + 1];
            uVar15 = uVar1;
          }
        } while( true );
      }
      stats[3] = -6;
      iVar10 = *p;
    }
    stats[4] = iVar10;
  }
  return 0;
}

Assistant:

PUBLIC Int SYMAMD_MAIN			/* return TRUE if OK, FALSE otherwise */
(
    /* === Parameters ======================================================= */

    Int n,				/* number of rows and columns of A */
    Int A [],				/* row indices of A */
    Int p [],				/* column pointers of A */
    Int perm [],			/* output permutation, size n+1 */
    double knobs [COLAMD_KNOBS],	/* parameters (uses defaults if NULL) */
    Int stats [COLAMD_STATS],		/* output statistics and error codes */
    void * (*allocate) (size_t, size_t),
    					/* pointer to calloc (ANSI C) or */
					/* mxCalloc (for MATLAB mexFunction) */
    void (*release) (void *)
    					/* pointer to free (ANSI C) or */
    					/* mxFree (for MATLAB mexFunction) */
)
{
    /* === Local variables ================================================== */

    Int *count ;		/* length of each column of M, and col pointer*/
    Int *mark ;			/* mark array for finding duplicate entries */
    Int *M ;			/* row indices of matrix M */
    size_t Mlen ;		/* length of M */
    Int n_row ;			/* number of rows in M */
    Int nnz ;			/* number of entries in A */
    Int i ;			/* row index of A */
    Int j ;			/* column index of A */
    Int k ;			/* row index of M */ 
    Int mnz ;			/* number of nonzeros in M */
    Int pp ;			/* index into a column of A */
    Int last_row ;		/* last row seen in the current column */
    Int length ;		/* number of nonzeros in a column */

    double cknobs [COLAMD_KNOBS] ;		/* knobs for colamd */
    double default_knobs [COLAMD_KNOBS] ;	/* default knobs for colamd */

#ifndef NDEBUG
    colamd_get_debug ("symamd") ;
#endif /* NDEBUG */

    /* === Check the input arguments ======================================== */

    if (!stats)
    {
	DEBUG0 (("symamd: stats not present\n")) ;
	return (FALSE) ;
    }
    for (i = 0 ; i < COLAMD_STATS ; i++)
    {
	stats [i] = 0 ;
    }
    stats [COLAMD_STATUS] = COLAMD_OK ;
    stats [COLAMD_INFO1] = -1 ;
    stats [COLAMD_INFO2] = -1 ;

    if (!A)
    {
    	stats [COLAMD_STATUS] = COLAMD_ERROR_A_not_present ;
	DEBUG0 (("symamd: A not present\n")) ;
	return (FALSE) ;
    }

    if (!p)		/* p is not present */
    {
	stats [COLAMD_STATUS] = COLAMD_ERROR_p_not_present ;
	DEBUG0 (("symamd: p not present\n")) ;
    	return (FALSE) ;
    }

    if (n < 0)		/* n must be >= 0 */
    {
	stats [COLAMD_STATUS] = COLAMD_ERROR_ncol_negative ;
	stats [COLAMD_INFO1] = n ;
	DEBUG0 (("symamd: n negative %d\n", n)) ;
    	return (FALSE) ;
    }

    nnz = p [n] ;
    if (nnz < 0)	/* nnz must be >= 0 */
    {
	stats [COLAMD_STATUS] = COLAMD_ERROR_nnz_negative ;
	stats [COLAMD_INFO1] = nnz ;
	DEBUG0 (("symamd: number of entries negative %d\n", nnz)) ;
	return (FALSE) ;
    }

    if (p [0] != 0)
    {
	stats [COLAMD_STATUS] = COLAMD_ERROR_p0_nonzero ;
	stats [COLAMD_INFO1] = p [0] ;
	DEBUG0 (("symamd: p[0] not zero %d\n", p [0])) ;
	return (FALSE) ;
    }

    /* === If no knobs, set default knobs =================================== */

    if (!knobs)
    {
	COLAMD_set_defaults (default_knobs) ;
	knobs = default_knobs ;
    }

    /* === Allocate count and mark ========================================== */

    count = (Int *) ((*allocate) (n+1, sizeof (Int))) ;
    if (!count)
    {
	stats [COLAMD_STATUS] = COLAMD_ERROR_out_of_memory ;
	DEBUG0 (("symamd: allocate count (size %d) failed\n", n+1)) ;
	return (FALSE) ;
    }

    mark = (Int *) ((*allocate) (n+1, sizeof (Int))) ;
    if (!mark)
    {
	stats [COLAMD_STATUS] = COLAMD_ERROR_out_of_memory ;
	(*release) ((void *) count) ;
	DEBUG0 (("symamd: allocate mark (size %d) failed\n", n+1)) ;
	return (FALSE) ;
    }

    /* === Compute column counts of M, check if A is valid ================== */

    stats [COLAMD_INFO3] = 0 ;  /* number of duplicate or unsorted row indices*/

    for (i = 0 ; i < n ; i++)
    {
    	mark [i] = -1 ;
    }

    for (j = 0 ; j < n ; j++)
    {
	last_row = -1 ;

	length = p [j+1] - p [j] ;
	if (length < 0)
	{
	    /* column pointers must be non-decreasing */
	    stats [COLAMD_STATUS] = COLAMD_ERROR_col_length_negative ;
	    stats [COLAMD_INFO1] = j ;
	    stats [COLAMD_INFO2] = length ;
	    (*release) ((void *) count) ;
	    (*release) ((void *) mark) ;
	    DEBUG0 (("symamd: col %d negative length %d\n", j, length)) ;
	    return (FALSE) ;
	}

	for (pp = p [j] ; pp < p [j+1] ; pp++)
	{
	    i = A [pp] ;
	    if (i < 0 || i >= n)
	    {
		/* row index i, in column j, is out of bounds */
		stats [COLAMD_STATUS] = COLAMD_ERROR_row_index_out_of_bounds ;
		stats [COLAMD_INFO1] = j ;
		stats [COLAMD_INFO2] = i ;
		stats [COLAMD_INFO3] = n ;
		(*release) ((void *) count) ;
		(*release) ((void *) mark) ;
		DEBUG0 (("symamd: row %d col %d out of bounds\n", i, j)) ;
		return (FALSE) ;
	    }

	    if (i <= last_row || mark [i] == j)
	    {
		/* row index is unsorted or repeated (or both), thus col */
		/* is jumbled.  This is a notice, not an error condition. */
		stats [COLAMD_STATUS] = COLAMD_OK_BUT_JUMBLED ;
		stats [COLAMD_INFO1] = j ;
		stats [COLAMD_INFO2] = i ;
		(stats [COLAMD_INFO3]) ++ ;
		DEBUG1 (("symamd: row %d col %d unsorted/duplicate\n", i, j)) ;
	    }

	    if (i > j && mark [i] != j)
	    {
		/* row k of M will contain column indices i and j */
		count [i]++ ;
		count [j]++ ;
	    }

	    /* mark the row as having been seen in this column */
	    mark [i] = j ;

	    last_row = i ;
	}
    }

    /* v2.4: removed free(mark) */

    /* === Compute column pointers of M ===================================== */

    /* use output permutation, perm, for column pointers of M */
    perm [0] = 0 ;
    for (j = 1 ; j <= n ; j++)
    {
	perm [j] = perm [j-1] + count [j-1] ;
    }
    for (j = 0 ; j < n ; j++)
    {
	count [j] = perm [j] ;
    }

    /* === Construct M ====================================================== */

    mnz = perm [n] ;
    n_row = mnz / 2 ;
    Mlen = COLAMD_recommended (mnz, n_row, n) ;
    M = (Int *) ((*allocate) (Mlen, sizeof (Int))) ;
    DEBUG0 (("symamd: M is %d-by-%d with %d entries, Mlen = %g\n",
    	n_row, n, mnz, (double) Mlen)) ;

    if (!M)
    {
	stats [COLAMD_STATUS] = COLAMD_ERROR_out_of_memory ;
	(*release) ((void *) count) ;
	(*release) ((void *) mark) ;
	DEBUG0 (("symamd: allocate M (size %g) failed\n", (double) Mlen)) ;
	return (FALSE) ;
    }

    k = 0 ;

    if (stats [COLAMD_STATUS] == COLAMD_OK)
    {
	/* Matrix is OK */
	for (j = 0 ; j < n ; j++)
	{
	    ASSERT (p [j+1] - p [j] >= 0) ;
	    for (pp = p [j] ; pp < p [j+1] ; pp++)
	    {
		i = A [pp] ;
		ASSERT (i >= 0 && i < n) ;
		if (i > j)
		{
		    /* row k of M contains column indices i and j */
		    M [count [i]++] = k ;
		    M [count [j]++] = k ;
		    k++ ;
		}
	    }
	}
    }
    else
    {
	/* Matrix is jumbled.  Do not add duplicates to M.  Unsorted cols OK. */
	DEBUG0 (("symamd: Duplicates in A.\n")) ;
	for (i = 0 ; i < n ; i++)
	{
	    mark [i] = -1 ;
	}
	for (j = 0 ; j < n ; j++)
	{
	    ASSERT (p [j+1] - p [j] >= 0) ;
	    for (pp = p [j] ; pp < p [j+1] ; pp++)
	    {
		i = A [pp] ;
		ASSERT (i >= 0 && i < n) ;
		if (i > j && mark [i] != j)
		{
		    /* row k of M contains column indices i and j */
		    M [count [i]++] = k ;
		    M [count [j]++] = k ;
		    k++ ;
		    mark [i] = j ;
		}
	    }
	}
	/* v2.4: free(mark) moved below */
    }

    /* count and mark no longer needed */
    (*release) ((void *) count) ;
    (*release) ((void *) mark) ;	/* v2.4: free (mark) moved here */
    ASSERT (k == n_row) ;

    /* === Adjust the knobs for M =========================================== */

    for (i = 0 ; i < COLAMD_KNOBS ; i++)
    {
	cknobs [i] = knobs [i] ;
    }

    /* there are no dense rows in M */
    cknobs [COLAMD_DENSE_ROW] = -1 ;
    cknobs [COLAMD_DENSE_COL] = knobs [COLAMD_DENSE_ROW] ;

    /* === Order the columns of M =========================================== */

    /* v2.4: colamd cannot fail here, so the error check is removed */
    (void) COLAMD_MAIN (n_row, n, (Int) Mlen, M, perm, cknobs, stats) ;

    /* Note that the output permutation is now in perm */

    /* === get the statistics for symamd from colamd ======================== */

    /* a dense column in colamd means a dense row and col in symamd */
    stats [COLAMD_DENSE_ROW] = stats [COLAMD_DENSE_COL] ;

    /* === Free M =========================================================== */

    (*release) ((void *) M) ;
    DEBUG0 (("symamd: done.\n")) ;
    return (TRUE) ;

}